

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t MATROSKA_Init(parsercontext *p)

{
  err_t eVar1;
  
  eVar1 = EBML_Init(p);
  if (eVar1 == 0) {
    NodeRegisterClassEx((nodemodule *)p,Matroska_Class);
    if (p == (parsercontext *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x28,"err_t MATROSKA_Init(parsercontext *)");
    }
    (**(code **)((long)(p->Base).Base.Base.VMT + 0x40))(p,0x402,4,"libmatroska2 v0.22.3");
    if (MATROSKA_init_once == '\0') {
      MATROSKA_init_once = '\x01';
      MATROSKA_InitSemantic();
      EBML_SemanticMatroska[0].eClass = EBML_getContextHead();
      EBML_SemanticMatroska[0].Mandatory = 1;
      EBML_SemanticMatroska[0].Unique = 0;
      EBML_SemanticMatroska[0].DisabledProfile = 0;
      EBML_SemanticMatroska[1].eClass = MATROSKA_getContextSegment();
      EBML_SemanticMatroska[1].Mandatory = 1;
      EBML_SemanticMatroska[1].Unique = 0;
      EBML_SemanticMatroska[1].DisabledProfile = 0;
      EBML_SemanticMatroska[2].Mandatory = 0;
      EBML_SemanticMatroska[2].Unique = 0;
      EBML_SemanticMatroska[2].eClass = (ebml_context *)0x0;
      EBML_SemanticMatroska[2].DisabledProfile = 0;
      EBML_SemanticMatroska[2]._28_4_ = 0;
      MATROSKA_ContextStream.GlobalContext = EBML_getSemanticGlobals();
      MATROSKA_ContextStream.Id = 0x5f584b4d;
      MATROSKA_ContextStream.Class = 0x544d4245;
      MATROSKA_ContextStream.HasDefault = 0;
      MATROSKA_ContextStream.DefaultValue = 0;
      MATROSKA_ContextStream.ElementName = "Matroska Stream";
      MATROSKA_ContextStream.Semantic = EBML_SemanticMatroska;
    }
  }
  return eVar1;
}

Assistant:

err_t MATROSKA_Init(parsercontext *p)
{
    err_t Err = EBML_Init(p);
    if (Err == ERR_NONE)
    {
        NodeRegisterClassEx(&p->Base.Base,Matroska_Class);

        Node_SetData(p,CONTEXT_LIBMATROSKA_VERSION,TYPE_STRING,T("libmatroska2 v") LIBMATROSKA2_PROJECT_VERSION);

        // TODO fix race condition
        if (!MATROSKA_init_once)
        {
            MATROSKA_init_once = 1;

            MATROSKA_InitSemantic();

            EBML_SemanticMatroska[0] = (ebml_semantic){1, 0, EBML_getContextHead()        ,0};
            EBML_SemanticMatroska[1] = (ebml_semantic){1, 0, MATROSKA_getContextSegment() ,0};
            EBML_SemanticMatroska[2] = (ebml_semantic){0, 0, NULL                         ,0}; // end of the table
            MATROSKA_ContextStream = (ebml_context){FOURCC('M','K','X','_'), EBML_MASTER_CLASS, 0, 0, "Matroska Stream", EBML_SemanticMatroska, EBML_getSemanticGlobals()};
        }
    }
    return Err;
}